

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.cpp
# Opt level: O1

bool __thiscall
slang::analysis::FlowAnalysisBase::isFullyCovered(FlowAnalysisBase *this,CaseStatement *stmt)

{
  char_pointer puVar1;
  char_pointer puVar2;
  pointer pIVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t sVar6;
  Symbol *pSVar7;
  pair<unsigned_int,_unsigned_int> pVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  SourceRange range;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  bitwidth_t bVar14;
  Expression *pEVar15;
  size_t sVar16;
  Diagnostic *pDVar17;
  Diagnostic *this_00;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_01;
  ConstantValue *this_02;
  char_pointer puVar18;
  char_pointer puVar19;
  uint uVar20;
  uint uVar21;
  pointer pIVar22;
  pointer ppEVar23;
  DiagCode code;
  EvalContext *pEVar24;
  EnumValueSymbol *ev;
  ulong uVar25;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> sVar26;
  char_pointer puVar27;
  char_pointer puVar28;
  undefined1 uVar29;
  CaseStatement *pCVar30;
  CaseStatement *source;
  Type *p;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ulong uVar31;
  CaseStatementCondition kind;
  SVInt *val;
  CaseStatement *pCVar32;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> sVar33;
  pointer this_03;
  int iVar34;
  ulong uVar35;
  table_element_pointer puVar36;
  table_element_pointer ppVar37;
  long lVar38;
  byte bVar39;
  double extraout_XMM0_Qa;
  double dVar40;
  undefined1 auVar41 [16];
  double extraout_XMM0_Qa_00;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  string_view sVar61;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar62;
  iterator iVar63;
  iterator iVar64;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  bitwidth_t bitWidth;
  ulong local_410;
  CaseStatement *local_408;
  Type *local_400;
  CaseStatement *local_3f8;
  ulong local_3f0;
  CaseStatement *local_3e8;
  FlowAnalysisBase *local_3e0;
  CaseStatement *local_3d8;
  EvalContext *local_3d0;
  pointer local_3c8;
  pointer local_3c0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_3b8;
  uint local_3b0;
  byte local_3ab;
  undefined1 local_3a8 [32];
  char local_388;
  char cStack_387;
  char cStack_386;
  char cStack_385;
  char cStack_384;
  char cStack_383;
  char cStack_382;
  char cStack_381;
  char cStack_380;
  char cStack_37f;
  char cStack_37e;
  char cStack_37d;
  char cStack_37c;
  char cStack_37b;
  char cStack_37a;
  char cStack_379;
  string msg;
  Expression *item;
  StatementSyntax *local_348;
  __extent_storage<18446744073709551615UL> local_340;
  Expression local_338;
  locator res;
  __index_type local_2e8;
  SmallVector<slang::SVInt,_2UL> intVals;
  SmallVector<const_slang::ast::Expression_*,_5UL> itemExpressions;
  optional<slang::analysis::CaseDecisionDag> decisionDag;
  SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  elems;
  
  local_400 = (stmt->expr->type).ptr;
  source = stmt;
  pEVar15 = ast::Expression::unwrapImplicitConversions(stmt->expr);
  bitWidth = ast::Type::getBitWidth((pEVar15->type).ptr);
  uVar35 = (ulong)stmt->condition;
  elems.super_Storage.ptr = (char *)&elems;
  elems._208_8_ = 0x3f;
  elems._216_8_ = 1;
  elems._224_16_ = ZEXT816(0x49b460);
  elems._240_8_ = 0;
  uVar31 = 0;
  elems._248_8_ = 0;
  intVals.super_SmallVectorBase<slang::SVInt>.data_ =
       (pointer)intVals.super_SmallVectorBase<slang::SVInt>.firstElement;
  intVals.super_SmallVectorBase<slang::SVInt>.len = 0;
  intVals.super_SmallVectorBase<slang::SVInt>.cap = 2;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  sVar6 = (stmt->items)._M_extent._M_extent_value;
  local_410 = uVar35;
  local_3f8 = stmt;
  local_3e0 = this;
  elems.super_Storage._200_8_ = elems.super_Storage.ptr;
  if (sVar6 != 0) {
    pIVar22 = (stmt->items)._M_ptr;
    pIVar3 = pIVar22 + sVar6;
    local_3d0 = &this->evalContext;
    uVar31 = 0;
    do {
      sVar6 = (pIVar22->expressions)._M_extent._M_extent_value;
      if (sVar6 != 0) {
        ppEVar23 = (pIVar22->expressions)._M_ptr;
        local_3c8 = ppEVar23 + sVar6;
        do {
          source = (CaseStatement *)*ppEVar23;
          local_3c0 = ppEVar23;
          item = (Expression *)source;
          ast::Expression::eval((ConstantValue *)&decisionDag,(Expression *)source,local_3d0);
          if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
              _M_payload.
              super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
              super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2[0x20]
              == '\0') {
            uVar31 = CONCAT71((int7)(uVar31 >> 8),1);
          }
          else {
            sVar16 = ConstantValue::hash((ConstantValue *)&decisionDag);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = sVar16;
            local_3e8 = (CaseStatement *)
                        (SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                        SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0));
            pCVar30 = (CaseStatement *)((ulong)local_3e8 >> (elems._208_1_ & 0x3f));
            lVar38 = ((ulong)local_3e8 & 0xff) * 4;
            cVar45 = (&UNK_0049b57c)[lVar38];
            cVar46 = (&UNK_0049b57d)[lVar38];
            cVar47 = (&UNK_0049b57e)[lVar38];
            cVar48 = (&UNK_0049b57f)[lVar38];
            uVar21 = (uint)local_3e8;
            uVar25 = 0;
            source = pCVar30;
            cVar49 = cVar45;
            cVar50 = cVar46;
            cVar51 = cVar47;
            cVar52 = cVar48;
            cVar53 = cVar45;
            cVar54 = cVar46;
            cVar55 = cVar47;
            cVar56 = cVar48;
            cVar57 = cVar45;
            cVar58 = cVar46;
            cVar59 = cVar47;
            cVar60 = cVar48;
            local_3f0 = uVar31;
            local_3d8 = pCVar30;
            do {
              uVar11 = elems._224_8_;
              pcVar4 = (char *)(elems._224_8_ + (long)pCVar30 * 0x10);
              auVar41[0] = -(*pcVar4 == cVar45);
              auVar41[1] = -(pcVar4[1] == cVar46);
              auVar41[2] = -(pcVar4[2] == cVar47);
              auVar41[3] = -(pcVar4[3] == cVar48);
              auVar41[4] = -(pcVar4[4] == cVar49);
              auVar41[5] = -(pcVar4[5] == cVar50);
              auVar41[6] = -(pcVar4[6] == cVar51);
              auVar41[7] = -(pcVar4[7] == cVar52);
              auVar41[8] = -(pcVar4[8] == cVar53);
              auVar41[9] = -(pcVar4[9] == cVar54);
              auVar41[10] = -(pcVar4[10] == cVar55);
              auVar41[0xb] = -(pcVar4[0xb] == cVar56);
              auVar41[0xc] = -(pcVar4[0xc] == cVar57);
              auVar41[0xd] = -(pcVar4[0xd] == cVar58);
              auVar41[0xe] = -(pcVar4[0xe] == cVar59);
              auVar41[0xf] = -(pcVar4[0xf] == cVar60);
              uVar20 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
              if (uVar20 != 0) {
                lVar38 = elems._232_8_ + (long)pCVar30 * 0x2d0;
                local_388 = cVar45;
                cStack_387 = cVar46;
                cStack_386 = cVar47;
                cStack_385 = cVar48;
                cStack_384 = cVar49;
                cStack_383 = cVar50;
                cStack_382 = cVar51;
                cStack_381 = cVar52;
                cStack_380 = cVar53;
                cStack_37f = cVar54;
                cStack_37e = cVar55;
                cStack_37d = cVar56;
                cStack_37c = cVar57;
                cStack_37b = cVar58;
                cStack_37a = cVar59;
                cStack_379 = cVar60;
                do {
                  iVar34 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
                    }
                  }
                  pCVar32 = (CaseStatement *)((ulong)(uint)(iVar34 * 0x30) + lVar38);
                  source = pCVar32;
                  bVar12 = slang::operator==((ConstantValue *)&decisionDag,(ConstantValue *)pCVar32)
                  ;
                  this = local_3e0;
                  uVar35 = local_410;
                  if (bVar12) goto LAB_004684e6;
                  uVar20 = uVar20 - 1 & uVar20;
                } while (uVar20 != 0);
                cVar45 = local_388;
                cVar46 = cStack_387;
                cVar47 = cStack_386;
                cVar48 = cStack_385;
                cVar49 = cStack_384;
                cVar50 = cStack_383;
                cVar51 = cStack_382;
                cVar52 = cStack_381;
                cVar53 = cStack_380;
                cVar54 = cStack_37f;
                cVar55 = cStack_37e;
                cVar56 = cStack_37d;
                cVar57 = cStack_37c;
                cVar58 = cStack_37b;
                cVar59 = cStack_37a;
                cVar60 = cStack_379;
                pCVar32 = local_408;
                if (bVar12) goto LAB_004684e6;
              }
              if ((*(byte *)(uVar11 + (long)pCVar30 * 0x10 + 0xf) &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[uVar21 & 7]) == 0) break;
              lVar38 = uVar25 - 0x17;
              uVar25 = uVar25 + 1;
              pCVar30 = (CaseStatement *)
                        ((ulong)(((SmallVectorBase<slang::SVInt> *)&pCVar30->super_Statement)->
                                 firstElement + lVar38) & elems._216_8_);
            } while (uVar25 <= (ulong)elems._216_8_);
            local_408 = (CaseStatement *)0x0;
            pCVar32 = local_408;
LAB_004684e6:
            local_408 = pCVar32;
            uVar31 = local_3f0;
            pCVar30 = local_408;
            if (local_408 == (CaseStatement *)0x0) {
              if ((ulong)elems._248_8_ < (ulong)elems._240_8_) {
                source = (CaseStatement *)&elems.super_Storage.field_0xc8;
                in_R9.values_ = (value<fmt::v11::context> *)&msg;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
                          (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                                 *)source,(arrays_type *)&elems.field_0xd0,(size_t)local_3d8,
                           (size_t)local_3e8,(try_emplace_args_t *)in_R9.values_,
                           (ConstantValue *)&decisionDag,&item);
                elems._248_8_ = elems._248_8_ + 1;
                pCVar30 = (CaseStatement *)res.p;
              }
              else {
                source = (CaseStatement *)&elems.super_Storage.field_0xc8;
                in_R9.values_ = (value<fmt::v11::context> *)&item;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
                          (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                                 *)source,(size_t)local_3e8,(try_emplace_args_t *)&msg,
                           (ConstantValue *)&decisionDag,(Expression **)in_R9.values_);
                pCVar30 = (CaseStatement *)res.p;
              }
            }
            if (local_408 == (CaseStatement *)0x0) {
              if ((*(char *)&pCVar30->expr == '\x01') &&
                 ((this_01 = std::
                             get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                         *)pCVar30), dVar40 = extraout_XMM0_Qa,
                  (CaseStatementCondition)uVar35 != WildcardJustZ ||
                  (bVar14 = SVInt::countXs(this_01), dVar40 = extraout_XMM0_Qa_00, bVar14 == 0)))) {
                SVInt::trunc((SVInt *)&res,dVar40);
                SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt>
                          (&intVals.super_SmallVectorBase<slang::SVInt>,(SVInt *)&res);
                if (((0x40 < res.n) || ((res._8_8_ & 0x10000000000) != 0)) &&
                   (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)0x0)) {
                  operator_delete__(res.pg);
                }
                source = (CaseStatement *)&item;
                SmallVectorBase<slang::ast::Expression_const*>::
                emplace_back<slang::ast::Expression_const*const&>
                          ((SmallVectorBase<slang::ast::Expression_const*> *)&itemExpressions,
                           (Expression **)source);
              }
            }
            else if (this->diagnostics != (Diagnostics *)0x0) {
              pDVar17 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0xd000e,
                                         item->sourceRange);
              sVar61 = ast::SemanticFacts::getCaseConditionStr((CaseStatementCondition)uVar35);
              this_00 = Diagnostic::operator<<(pDVar17,sVar61);
              Diagnostic::operator<<(this_00,(ConstantValue *)pCVar30);
              pSVar7 = (Symbol *)(pCVar30->items)._M_ptr;
              range.startLoc = (SourceLocation)pSVar7->parentScope;
              range.endLoc = (SourceLocation)pSVar7->nextInScope;
              source = (CaseStatement *)0xc0001;
              Diagnostic::addNote(pDVar17,(DiagCode)0xc0001,range);
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&decisionDag);
          if ((this->diagnostics != (Diagnostics *)0x0 && (uVar35 & 0xfffffffd) == 0) &&
             (pEVar15 = ast::Expression::unwrapImplicitConversions(item),
             pEVar15->kind == IntegerLiteral)) {
            if ((int)uVar35 == 0) {
              source = (CaseStatement *)&pEVar15[1].type;
              SVInt::SVInt((SVInt *)&local_338.sourceRange,(SVIntStorage *)source);
              uVar29 = local_338.sourceRange.endLoc._5_1_;
              if (((0x40 < (uint)local_338.sourceRange.endLoc._0_4_) ||
                  ((local_338.sourceRange.endLoc._5_1_ & 1) != None >> 8)) &&
                 (local_338.sourceRange.startLoc != (SourceLocation)0x0)) {
                operator_delete__((void *)local_338.sourceRange.startLoc);
              }
            }
            else {
              uVar29 = None >> 8;
            }
            code.subsystem = Analysis;
            code.code = 0x11;
            if (uVar29 == None >> 8) {
              if ((int)uVar35 == 2) {
                source = (CaseStatement *)&pEVar15[1].type;
                SVInt::SVInt((SVInt *)&local_3b8,(SVIntStorage *)source);
                bVar14 = SVInt::countXs((SVInt *)&local_3b8);
                bVar12 = bVar14 != 0;
                if (((0x40 < local_3b0) || ((local_3ab & 1) != 0)) &&
                   ((void *)local_3b8.val != (void *)0x0)) {
                  operator_delete__(local_3b8.pVal);
                }
              }
              else {
                bVar12 = false;
              }
              code.subsystem = Analysis;
              code.code = 0x14;
              if (!bVar12) goto LAB_00468762;
            }
            source = (CaseStatement *)this->rootSymbol;
            Diagnostics::add(this->diagnostics,(Symbol *)source,code,item->sourceRange);
          }
LAB_00468762:
          ppEVar23 = local_3c0 + 1;
        } while (ppEVar23 != local_3c8);
      }
      pIVar22 = pIVar22 + 1;
    } while (pIVar22 != pIVar3);
  }
  uVar35 = local_410;
  decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>._M_payload.
  super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
  super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_engaged = false;
  if (this->diagnostics != (Diagnostics *)0x0) {
    iVar34 = (int)local_410;
    if (local_400->canonical == (Type *)0x0) {
      ast::Type::resolveCanonical(local_400);
    }
    local_3f0 = uVar31;
    if ((local_400->canonical->super_Symbol).kind == EnumType) {
      item = &local_338;
      local_348 = (StatementSyntax *)0x0;
      local_340._M_extent_value = 2;
      sVar62 = ast::Scope::membersOfType<slang::ast::EnumValueSymbol>
                         ((Scope *)&local_400->canonical[1].super_Symbol.name);
      if (sVar62._M_begin.current.current != sVar62._M_end.current.current) {
        do {
          sVar33 = sVar62._M_end.current;
          sVar26 = sVar62._M_begin.current;
          this_02 = ast::EnumValueSymbol::getValue
                              ((EnumValueSymbol *)sVar26.current,(SourceRange)ZEXT816(0));
          sVar16 = ConstantValue::hash(this_02);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = sVar16;
          uVar25 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
          source = (CaseStatement *)(uVar25 >> (elems._208_1_ & 0x3f));
          lVar38 = (uVar25 & 0xff) * 4;
          cVar45 = (&UNK_0049b57c)[lVar38];
          cVar46 = (&UNK_0049b57d)[lVar38];
          cVar47 = (&UNK_0049b57e)[lVar38];
          cVar48 = (&UNK_0049b57f)[lVar38];
          pEVar24 = (EvalContext *)(ulong)((uint)uVar25 & 7);
          pCVar30 = (CaseStatement *)0x0;
          cVar49 = cVar45;
          cVar50 = cVar46;
          cVar51 = cVar47;
          cVar52 = cVar48;
          cVar53 = cVar45;
          cVar54 = cVar46;
          cVar55 = cVar47;
          cVar56 = cVar48;
          cVar57 = cVar45;
          cVar58 = cVar46;
          cVar59 = cVar47;
          cVar60 = cVar48;
          do {
            local_3c8 = (pointer)((long)source * 0x10);
            local_3c0 = (pointer)elems._224_8_;
            pcVar4 = (char *)(elems._224_8_ + (long)local_3c8);
            auVar42[0] = -(*pcVar4 == cVar45);
            auVar42[1] = -(pcVar4[1] == cVar46);
            auVar42[2] = -(pcVar4[2] == cVar47);
            auVar42[3] = -(pcVar4[3] == cVar48);
            auVar42[4] = -(pcVar4[4] == cVar49);
            auVar42[5] = -(pcVar4[5] == cVar50);
            auVar42[6] = -(pcVar4[6] == cVar51);
            auVar42[7] = -(pcVar4[7] == cVar52);
            auVar42[8] = -(pcVar4[8] == cVar53);
            auVar42[9] = -(pcVar4[9] == cVar54);
            auVar42[10] = -(pcVar4[10] == cVar55);
            auVar42[0xb] = -(pcVar4[0xb] == cVar56);
            auVar42[0xc] = -(pcVar4[0xc] == cVar57);
            auVar42[0xd] = -(pcVar4[0xd] == cVar58);
            auVar42[0xe] = -(pcVar4[0xe] == cVar59);
            auVar42[0xf] = -(pcVar4[0xf] == cVar60);
            uVar21 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
            pCVar32 = pCVar30;
            if (uVar21 != 0) {
              lVar38 = elems._232_8_ + (long)source * 0x2d0;
              local_3e8 = source;
              local_3d8 = pCVar30;
              local_3d0 = pEVar24;
              local_388 = cVar45;
              cStack_387 = cVar46;
              cStack_386 = cVar47;
              cStack_385 = cVar48;
              cStack_384 = cVar49;
              cStack_383 = cVar50;
              cStack_382 = cVar51;
              cStack_381 = cVar52;
              cStack_380 = cVar53;
              cStack_37f = cVar54;
              cStack_37e = cVar55;
              cStack_37d = cVar56;
              cStack_37c = cVar57;
              cStack_37b = cVar58;
              cStack_37a = cVar59;
              cStack_379 = cVar60;
              do {
                iVar34 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
                  }
                }
                pCVar30 = (CaseStatement *)((ulong)(uint)(iVar34 * 0x30) + lVar38);
                source = pCVar30;
                bVar12 = slang::operator==(this_02,(ConstantValue *)pCVar30);
                uVar31 = local_3f0;
                uVar35 = local_410;
                if (bVar12) goto LAB_004689a8;
                uVar21 = uVar21 - 1 & uVar21;
              } while (uVar21 != 0);
              pCVar32 = local_3d8;
              pEVar24 = local_3d0;
              source = local_3e8;
              cVar45 = local_388;
              cVar46 = cStack_387;
              cVar47 = cStack_386;
              cVar48 = cStack_385;
              cVar49 = cStack_384;
              cVar50 = cStack_383;
              cVar51 = cStack_382;
              cVar52 = cStack_381;
              cVar53 = cStack_380;
              cVar54 = cStack_37f;
              cVar55 = cStack_37e;
              cVar56 = cStack_37d;
              cVar57 = cStack_37c;
              cVar58 = cStack_37b;
              cVar59 = cStack_37a;
              cVar60 = cStack_379;
              pCVar30 = local_408;
              if (bVar12) goto LAB_004689a8;
            }
            if ((*(byte *)((long)local_3c0 + (long)local_3c8 + 0xf) &
                pEVar24[0x1641].diags.super_SmallVector<slang::Diagnostic,_2UL>.stackBase[0x50]) ==
                0) break;
            pCVar30 = (CaseStatement *)
                      ((long)&((SmallVectorBase<slang::SVInt> *)&pCVar32->super_Statement)->data_ +
                      1);
            source = (CaseStatement *)
                     ((ulong)((undefined1 *)
                              ((long)&((SmallVectorBase<slang::SVInt> *)&source->super_Statement)->
                                      data_ + 1) +
                             (long)(((SmallVectorBase<slang::SVInt> *)&pCVar32->super_Statement)->
                                    firstElement + -0x18)) & elems._216_8_);
          } while (pCVar30 <= (ulong)elems._216_8_);
          local_408 = (CaseStatement *)0x0;
          pCVar30 = local_408;
LAB_004689a8:
          local_408 = pCVar30;
          iVar34 = (int)uVar35;
          if (local_408 == (CaseStatement *)0x0) {
            source = (CaseStatement *)&(sVar26.current)->name;
            SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                      ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)&item
                       ,(basic_string_view<char,_std::char_traits<char>_> *)source);
          }
          for (sVar26.current = (sVar26.current)->nextInScope;
              (sVar26.current != (Symbol *)0x0 && ((sVar26.current)->kind != EnumValue));
              sVar26.current = (sVar26.current)->nextInScope) {
          }
          sVar62._M_end.current = sVar33.current;
          sVar62._M_begin.current = sVar26.current;
          this = local_3e0;
        } while (sVar26.current != sVar33.current);
      }
      if (local_348 != (StatementSyntax *)0x0) {
        paVar5 = &msg.field_2;
        msg._M_string_length = 0;
        msg.field_2._M_local_buf[0] = '\0';
        msg._M_dataplus._M_p = (pointer)paVar5;
        if (local_348 == (StatementSyntax *)0x3) {
          res.n = item->kind;
          res._12_4_ = *(undefined4 *)&item->field_0x4;
          res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)(item->type).ptr;
          res.p = (pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *)item->syntax;
          local_2e8 = SUB81((item->sourceRange).endLoc,0);
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&res;
          fmt_01.size_ = 0xddd;
          fmt_01.data_ = (char *)0x1b;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_3a8,(v11 *)"values \'{}\', \'{}\', and \'{}\'",fmt_01,args_01);
LAB_004690ed:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3a8);
          p = (Type *)local_3a8._0_8_;
          if ((Type *)local_3a8._0_8_ != (Type *)(local_3a8 + 0x10)) {
LAB_0046911a:
            operator_delete(p,(size_t)((long)&(((pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>
                                                 *)local_3a8._16_8_)->first).value.
                                              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                              .
                                              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                              .
                                              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                              .
                                              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                              .
                                              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                      + 1));
          }
        }
        else {
          if (local_348 == (StatementSyntax *)0x2) {
            res.n = item->kind;
            res._12_4_ = *(undefined4 *)&item->field_0x4;
            res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)(item->type).ptr;
            res.p = (pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *)item->syntax
            ;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)&res;
            fmt_00.size_ = 0xdd;
            fmt_00.data_ = (char *)0x14;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_3a8,(v11 *)"values \'{}\' and \'{}\'",fmt_00,args_00);
            goto LAB_004690ed;
          }
          if (local_348 != (StatementSyntax *)0x1) {
            res.n = item->kind;
            res._12_4_ = *(undefined4 *)&item->field_0x4;
            res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)(item->type).ptr;
            res.p = (pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *)item->syntax
            ;
            local_2e8 = SUB81((item->sourceRange).endLoc,0);
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&res;
            fmt_02.size_ = 0xc4ddd;
            fmt_02.data_ = (char *)0x28;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_3a8,(v11 *)"values \'{}\', \'{}\', \'{}\' (and {} other{})",
                       fmt_02,args_02);
            goto LAB_004690ed;
          }
          local_3a8._8_8_ = *(undefined8 *)item;
          local_3a8._0_8_ = (item->type).ptr;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)local_3a8;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0xa;
          ::fmt::v11::vformat_abi_cxx11_((string *)&res,(v11 *)0x4adcf2,fmt,args);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res)
          ;
          local_3a8._16_8_ = res.p;
          p = (Type *)res.pg;
          if (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)&res.p)
          goto LAB_0046911a;
        }
        pDVar17 = Diagnostics::add(this->diagnostics,this->rootSymbol,
                                   (DiagCode)
                                   ((uint)(local_3f8->defaultCase != (Statement *)0x0) << 0x10 |
                                   0xe000e),local_3f8->expr->sourceRange);
        source = (CaseStatement *)&msg;
        Diagnostic::operator<<(pDVar17,(string *)source);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar5) {
          source = (CaseStatement *)
                   (CONCAT71(msg.field_2._M_allocated_capacity._1_7_,msg.field_2._M_local_buf[0]) +
                   1);
          operator_delete(msg._M_dataplus._M_p,(size_t)source);
        }
      }
      if (item != &local_338) {
        operator_delete(item);
      }
    }
    if (iVar34 - 1U < 2) {
      kind = (CaseStatementCondition)local_410;
      res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
               CONCAT71(res.pg._1_7_,kind == WildcardXOrZ);
      source = (CaseStatement *)&intVals;
      std::optional<slang::analysis::CaseDecisionDag>::
      emplace<slang::SmallVector<slang::SVInt,2ul>&,unsigned_int_const&,bool,unsigned_int_const&>
                (&decisionDag,(SmallVector<slang::SVInt,_2UL> *)source,&bitWidth,(bool *)&res,
                 &(this->options).maxCaseAnalysisSteps);
      if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
          _M_payload.super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
          super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload._M_value.gaveUp
          == true) {
        pDVar17 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0xc000e,
                                   local_3f8->expr->sourceRange);
        sVar61 = ast::SemanticFacts::getCaseConditionStr((CaseStatementCondition)local_410);
        source = (CaseStatement *)sVar61._M_len;
        Diagnostic::operator<<(pDVar17,sVar61);
      }
      else {
        if ((decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
             _M_payload.
             super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
             super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload._M_value.
             counterexample.super__Optional_base<slang::SVInt,_false,_false>._M_payload.
             super__Optional_payload<slang::SVInt,_true,_false,_false>.
             super__Optional_payload_base<slang::SVInt>._M_engaged == true) &&
           (local_3f8->defaultCase == (Statement *)0x0)) {
          pDVar17 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x10000e,
                                     local_3f8->expr->sourceRange);
          sVar61 = ast::SemanticFacts::getCaseConditionStr(kind);
          Diagnostic::operator<<(pDVar17,sVar61);
          SVInt::SVInt((SVInt *)&res,
                       (SVIntStorage *)
                       &decisionDag.
                        super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                        _M_payload.
                        super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                        .super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.
                        _M_value.counterexample);
          source = (CaseStatement *)&res;
          local_2e8 = '\x01';
          Diagnostic::operator<<(pDVar17,(ConstantValue *)source);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&res);
        }
        iVar63 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::begin((table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&decisionDag);
        if (iVar63.p_ != (table_element_pointer)0x0) {
LAB_00468b3b:
          pDVar17 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x13000e,
                                     itemExpressions.
                                     super_SmallVectorBase<const_slang::ast::Expression_*>.data_
                                     [*iVar63.p_]->sourceRange);
          sVar61 = ast::SemanticFacts::getCaseConditionStr((CaseStatementCondition)local_410);
          source = (CaseStatement *)sVar61._M_len;
          Diagnostic::operator<<(pDVar17,sVar61);
          puVar18 = iVar63.pc_ + 2;
          do {
            puVar27 = puVar18;
            puVar18 = iVar63.pc_;
            puVar36 = iVar63.p_ + 1;
            if (((uint)iVar63.pc_ & 0xf) == 0xe) goto LAB_00468bb4;
            puVar1 = puVar27 + -1;
            iVar63.p_ = puVar36;
            iVar63.pc_ = puVar18 + 1;
            puVar18 = puVar27 + 1;
          } while (*puVar1 == '\0');
          puVar27 = puVar27 + -1;
          if (*puVar1 == '\x01') {
            puVar36 = (table_element_pointer)0x0;
          }
          goto LAB_00468ba8;
        }
LAB_00468bfd:
        iVar64 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::begin(&decisionDag.
                          super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                          _M_payload.
                          super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                          .super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload
                          ._M_value.overlappingClauses.table_);
        if (iVar64.p_ != (table_element_pointer)0x0) {
LAB_00468c1e:
          pVar8 = *iVar64.p_;
          pDVar17 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x12000e,
                                     itemExpressions.
                                     super_SmallVectorBase<const_slang::ast::Expression_*>.data_
                                     [(ulong)pVar8 >> 0x20]->sourceRange);
          sVar61 = ast::SemanticFacts::getCaseConditionStr((CaseStatementCondition)local_410);
          pDVar17 = Diagnostic::operator<<(pDVar17,sVar61);
          source = (CaseStatement *)0xc0001;
          Diagnostic::addNote(pDVar17,(DiagCode)0xc0001,
                              itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.
                              data_[(ulong)pVar8 & 0xffffffff]->sourceRange);
          puVar19 = iVar64.pc_ + 2;
          do {
            puVar28 = puVar19;
            puVar19 = iVar64.pc_;
            ppVar37 = iVar64.p_ + 1;
            if (((uint)iVar64.pc_ & 0xf) == 0xe) goto LAB_00468ccb;
            puVar2 = puVar28 + -1;
            iVar64.p_ = ppVar37;
            iVar64.pc_ = puVar19 + 1;
            puVar19 = puVar28 + 1;
          } while (*puVar2 == '\0');
          puVar28 = puVar28 + -1;
          if (*puVar2 == '\x01') {
            ppVar37 = (table_element_pointer)0x0;
          }
          goto LAB_00468cbb;
        }
      }
    }
  }
LAB_00468d14:
  if ((((this->options).flags.m_bits & 2) == 0) ||
     (bVar39 = 1, (local_3f8->check | Unique0) != Priority)) {
    bVar13 = ast::Type::isIntegral(local_400);
    pCVar30 = local_3f8;
    uVar35 = local_410;
    bVar12 = (uVar31 & 1) == 0;
    if (bVar13 && bVar12) {
      source = (CaseStatement *)local_3f8->expr;
      ast::Expression::eval((ConstantValue *)&res,(Expression *)source,&this->evalContext);
    }
    if (bVar13 && (uVar31 & 1) == 0) {
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&res);
    }
    if (((bVar13 && bVar12) && local_2e8 == '\0') && pCVar30->condition != Inside) {
      uVar21 = (this->options).flags.m_bits;
      if ((pCVar30->condition != Normal) && (bVar12 = ast::Type::isFourState(local_400), bVar12)) {
        if ((uVar21 & 4) == 0) {
          if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
              _M_payload.
              super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
              super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_engaged == false) {
            item = (Expression *)CONCAT71(item._1_7_,(int)uVar35 == 1);
            source = (CaseStatement *)&intVals;
            std::optional<slang::analysis::CaseDecisionDag>::
            emplace<slang::SmallVector<slang::SVInt,2ul>&,unsigned_int_const&,bool,unsigned_int_const&>
                      (&decisionDag,(SmallVector<slang::SVInt,_2UL> *)source,&bitWidth,(bool *)&item
                       ,&(this->options).maxCaseAnalysisSteps);
          }
          bVar39 = decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                   _M_payload.
                   super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
                   super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2
                   [0x70] ^ 1;
        }
        else {
          bVar39 = intVals.super_SmallVectorBase<slang::SVInt>.len != 0;
          if ((bool)bVar39) {
            lVar38 = intVals.super_SmallVectorBase<slang::SVInt>.len << 4;
            this_03 = intVals.super_SmallVectorBase<slang::SVInt>.data_;
            do {
              bVar14 = SVInt::countLeadingZs(this_03);
              if (bitWidth <= bVar14) break;
              this_03 = this_03 + 1;
              lVar38 = lVar38 + -0x10;
              bVar39 = lVar38 != 0;
            } while ((bool)bVar39);
          }
        }
        goto LAB_00468d95;
      }
      bVar12 = ast::Type::isFourState(local_400);
      uVar11 = elems._248_8_;
      if (bVar12 && (uVar21 & 4) != 0) {
        if (bitWidth < 0x10) {
          dVar40 = exp2((double)(int)(bitWidth * 2));
          bVar39 = (ulong)((long)(dVar40 - 9.223372036854776e+18) & (long)dVar40 >> 0x3f |
                          (long)dVar40) <= (ulong)uVar11;
          goto LAB_00468d95;
        }
      }
      else if (bitWidth < 0x20) {
        bVar39 = (ulong)elems._248_8_ >> ((byte)bitWidth & 0x3f) != 0;
        goto LAB_00468d95;
      }
    }
    bVar39 = 0;
  }
LAB_00468d95:
  if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>._M_payload.
      super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
      super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_engaged == true) {
    std::_Optional_payload_base<slang::analysis::CaseDecisionDag>::_M_destroy
              ((_Optional_payload_base<slang::analysis::CaseDecisionDag> *)&decisionDag);
  }
  if (itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ !=
      (pointer)itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement) {
    operator_delete(itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.data_);
  }
  SmallVectorBase<slang::SVInt>::cleanup
            (&intVals.super_SmallVectorBase<slang::SVInt>,(EVP_PKEY_CTX *)source);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                 *)&elems.super_Storage.field_0xc8);
  return (bool)(bVar39 & 1);
LAB_00468bb4:
  do {
    auVar43[0] = -(*puVar27 == '\0');
    auVar43[1] = -(puVar27[1] == '\0');
    auVar43[2] = -(puVar27[2] == '\0');
    auVar43[3] = -(puVar27[3] == '\0');
    auVar43[4] = -(puVar27[4] == '\0');
    auVar43[5] = -(puVar27[5] == '\0');
    auVar43[6] = -(puVar27[6] == '\0');
    auVar43[7] = -(puVar27[7] == '\0');
    auVar43[8] = -(puVar27[8] == '\0');
    auVar43[9] = -(puVar27[9] == '\0');
    auVar43[10] = -(puVar27[10] == '\0');
    auVar43[0xb] = -(puVar27[0xb] == '\0');
    auVar43[0xc] = -(puVar27[0xc] == '\0');
    auVar43[0xd] = -(puVar27[0xd] == '\0');
    auVar43[0xe] = -(puVar27[0xe] == '\0');
    auVar43[0xf] = -(puVar27[0xf] == '\0');
    uVar21 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
    if (uVar21 == 0x7fff) {
      puVar27 = puVar27 + 0x10;
      puVar36 = puVar36 + 0xf;
    }
    else {
      uVar20 = 0;
      if ((uVar21 ^ 0x7fff) != 0) {
        for (; ((uVar21 ^ 0x7fff) >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      if (puVar27[uVar20] == '\x01') {
        puVar36 = (table_element_pointer)0x0;
      }
      else {
        puVar27 = puVar27 + uVar20;
        puVar36 = puVar36 + uVar20;
      }
    }
  } while (uVar21 == 0x7fff);
LAB_00468ba8:
  iVar63.p_ = puVar36;
  iVar63.pc_ = puVar27;
  if (puVar36 == (table_element_pointer)0x0) goto LAB_00468bfd;
  goto LAB_00468b3b;
LAB_00468ccb:
  do {
    auVar44[0] = -(*puVar28 == '\0');
    auVar44[1] = -(puVar28[1] == '\0');
    auVar44[2] = -(puVar28[2] == '\0');
    auVar44[3] = -(puVar28[3] == '\0');
    auVar44[4] = -(puVar28[4] == '\0');
    auVar44[5] = -(puVar28[5] == '\0');
    auVar44[6] = -(puVar28[6] == '\0');
    auVar44[7] = -(puVar28[7] == '\0');
    auVar44[8] = -(puVar28[8] == '\0');
    auVar44[9] = -(puVar28[9] == '\0');
    auVar44[10] = -(puVar28[10] == '\0');
    auVar44[0xb] = -(puVar28[0xb] == '\0');
    auVar44[0xc] = -(puVar28[0xc] == '\0');
    auVar44[0xd] = -(puVar28[0xd] == '\0');
    auVar44[0xe] = -(puVar28[0xe] == '\0');
    auVar44[0xf] = -(puVar28[0xf] == '\0');
    uVar21 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe);
    if (uVar21 == 0x7fff) {
      puVar28 = puVar28 + 0x10;
      ppVar37 = ppVar37 + 0xf;
    }
    else {
      uVar20 = 0;
      if ((uVar21 ^ 0x7fff) != 0) {
        for (; ((uVar21 ^ 0x7fff) >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      if (puVar28[uVar20] == '\x01') {
        ppVar37 = (table_element_pointer)0x0;
      }
      else {
        puVar28 = puVar28 + uVar20;
        ppVar37 = ppVar37 + uVar20;
      }
    }
  } while (uVar21 == 0x7fff);
LAB_00468cbb:
  iVar64.p_ = ppVar37;
  iVar64.pc_ = puVar28;
  uVar31 = local_3f0;
  if (ppVar37 == (table_element_pointer)0x0) goto LAB_00468d14;
  goto LAB_00468c1e;
}

Assistant:

bool FlowAnalysisBase::isFullyCovered(const CaseStatement& stmt) const {
    // This method determines whether a case statement's items fully cover
    // the input space, so that we know whether the default statement
    // (if there is one) is reachable or not.
    //
    // Also while we're here we will issue some diagnostics for lint issues like
    // overlapping case items and duplicate case items, if this analysis has been
    // configured to report diagnostics.

    const auto& caseType = *stmt.expr.type;
    const auto bitWidth = stmt.expr.unwrapImplicitConversions().type->getBitWidth();
    const auto cond = stmt.condition;
    const bool wildcard = cond == CaseStatementCondition::WildcardXOrZ ||
                          cond == CaseStatementCondition::WildcardJustZ;

    // Collect all constant case values, checking for duplicates and overlaps
    // if we are looking for diagnostics.
    bool hasNonConstItems = false;
    SmallMap<ConstantValue, const Expression*, 4> elems;
    SmallVector<SVInt> intVals;
    SmallVector<const Expression*> itemExpressions;
    for (auto& g : stmt.items) {
        for (auto item : g.expressions) {
            if (auto cv = item->eval(evalContext)) {
                auto [it, inserted] = elems.emplace(std::move(cv), item);
                if (!inserted) {
                    if (diagnostics) {
                        auto& diag = diagnostics->add(rootSymbol, diag::CaseDup, item->sourceRange);
                        diag << SemanticFacts::getCaseConditionStr(cond) << it->first;
                        diag.addNote(diag::NotePreviousUsage, it->second->sourceRange);
                    }
                }
                else if (it->first.isInteger()) {
                    // Save off the values for later use in building the decision
                    // DAG. One weid thing here: if the value has x bits and we're
                    // not in a casex statement we should ignore the item, since we
                    // won't check for coverage of x bits in the decision DAG and these
                    // clauses will show up as unreachable otherwise.
                    auto& val = it->first.integer();
                    if (cond != CaseStatementCondition::WildcardJustZ || val.countXs() == 0) {
                        intVals.push_back(val.trunc(bitWidth));
                        itemExpressions.push_back(item);
                    }
                }
            }
            else {
                hasNonConstItems = true;
            }

            if (diagnostics && (cond == CaseStatementCondition::Normal ||
                                cond == CaseStatementCondition::WildcardJustZ)) {
                // If we're not in a wildcard case we should warn
                // about integer literal items that have unknown bits.
                // Similarly, if we're in a wildcard case with just Zs
                // we should warn if we see Xs.
                auto& unwrapped = item->unwrapImplicitConversions();
                if (unwrapped.kind == ExpressionKind::IntegerLiteral) {
                    auto& lit = unwrapped.as<IntegerLiteral>();
                    if (cond == CaseStatementCondition::Normal && lit.getValue().hasUnknown()) {
                        diagnostics->add(rootSymbol, diag::CaseNotWildcard, item->sourceRange);
                    }
                    else if (cond == CaseStatementCondition::WildcardJustZ &&
                             lit.getValue().countXs() > 0) {
                        diagnostics->add(rootSymbol, diag::CaseZWithX, item->sourceRange);
                    }
                }
            }
        }
    }

    std::optional<CaseDecisionDag> decisionDag;
    auto makeDecisionDag = [&]() {
        decisionDag.emplace(intVals, bitWidth, cond == CaseStatementCondition::WildcardXOrZ,
                            options.maxCaseAnalysisSteps);
    };

    // If diagnostics are enabled do various lint checks now.
    if (diagnostics) {
        // Check for missing enum coverage.
        if (caseType.isEnum()) {
            SmallVector<std::string_view> missing;
            for (auto& ev : caseType.getCanonicalType().as<EnumType>().values()) {
                auto& val = ev.getValue();
                if (!elems.contains(val))
                    missing.push_back(ev.name);
            }

            if (!missing.empty()) {
                std::string msg;
                if (missing.size() == 1) {
                    msg = fmt::format("value '{}'", missing[0]);
                }
                else if (missing.size() == 2) {
                    msg = fmt::format("values '{}' and '{}'", missing[0], missing[1]);
                }
                else if (missing.size() == 3) {
                    msg = fmt::format("values '{}', '{}', and '{}'", missing[0], missing[1],
                                      missing[2]);
                }
                else {
                    const size_t remainder = missing.size() - 3;
                    msg = fmt::format("values '{}', '{}', '{}' (and {} other{})", missing[0],
                                      missing[1], missing[2], remainder, remainder == 1 ? "" : "s");
                }

                auto code = stmt.defaultCase ? diag::CaseEnumExplicit : diag::CaseEnum;
                diagnostics->add(rootSymbol, code, stmt.expr.sourceRange) << msg;
            }
        }

        // If this is a wildcard case statement check for overlaps.
        if (wildcard) {
            makeDecisionDag();

            if (decisionDag->gaveUp) {
                auto& diag = diagnostics->add(rootSymbol, diag::CaseComplex, stmt.expr.sourceRange);
                diag << SemanticFacts::getCaseConditionStr(cond);
            }
            else {
                if (decisionDag->counterexample && !stmt.defaultCase) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseIncomplete,
                                                  stmt.expr.sourceRange);
                    diag << SemanticFacts::getCaseConditionStr(cond);
                    diag << *decisionDag->counterexample;
                }

                for (auto index : decisionDag->unreachableClauses) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseUnreachable,
                                                  itemExpressions[index]->sourceRange);
                    diag << SemanticFacts::getCaseConditionStr(cond);
                }

                for (auto [first, second] : decisionDag->overlappingClauses) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseOverlap,
                                                  itemExpressions[second]->sourceRange)
                                 << SemanticFacts::getCaseConditionStr(cond);
                    diag.addNote(diag::NotePreviousUsage, itemExpressions[first]->sourceRange);
                }
            }
        }
    }

    // If the case statement asserts it has full coverage, and our flags allow it,
    // assume full coverage without checking.
    if (options.flags.has(AnalysisFlags::FullCaseUniquePriority) &&
        (stmt.check == UniquePriorityCheck::Unique ||
         stmt.check == UniquePriorityCheck::Priority)) {
        return true;
    }

    // If the case type is not integral then we can never fully satisfy the condition.
    // Non-constant items or constant condition is also not coverable.
    if (!caseType.isIntegral() || hasNonConstItems || stmt.expr.eval(evalContext))
        return false;

    // TODO: handle case inside
    if (stmt.condition == CaseStatementCondition::Inside)
        return false;

    const bool fullCaseFourState = options.flags.has(AnalysisFlags::FullCaseFourState);
    if (stmt.condition == CaseStatementCondition::Normal || !caseType.isFourState()) {
        // The number of non-duplicate elements needs to match the number
        // of possible values for the case expression. This depends on
        // whether the type is 2-state or 4-state.
        if (caseType.isFourState() && fullCaseFourState)
            return bitWidth < 16 && elems.size() >= (size_t)std::pow(4, bitWidth);
        else
            return bitWidth < 32 && elems.size() >= (1ull << bitWidth);
    }

    // If we're checking for four-state wildcard coverage we simply need to
    // find an entry that is all Z bits. This is because Z is always a wildcard,
    // so the only way to specify an entry that hits all Z's will also cover
    // all other bits too.
    if (fullCaseFourState) {
        for (auto& val : intVals) {
            if (val.countLeadingZs() >= bitWidth)
                return true;
        }
        return false;
    }

    // Otherwise do the full wildcard coverage search.
    if (!decisionDag)
        makeDecisionDag();

    return decisionDag->isExhaustive();
}